

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  byte bVar1;
  char cVar2;
  ImGuiTableColumn *pIVar3;
  int iVar4;
  int sort_n;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  if (table->ColumnsCount < 1) {
    iVar4 = 0;
    lVar8 = 1;
  }
  else {
    lVar8 = 0x56;
    lVar9 = 0;
    iVar4 = 0;
    uVar6 = 0;
    do {
      pIVar3 = (table->Columns).Data;
      if ((*(char *)((long)&pIVar3->Flags + lVar8) != -1) &&
         (*(char *)((long)&pIVar3->WidthGiven + lVar8) == '\0')) {
        *(undefined1 *)((long)&pIVar3->Flags + lVar8) = 0xff;
      }
      bVar1 = *(byte *)((long)&pIVar3->Flags + lVar8);
      uVar7 = 1L << (bVar1 & 0x3f);
      if (bVar1 == 0xff) {
        uVar7 = 0;
      }
      uVar6 = uVar6 | uVar7;
      iVar4 = iVar4 + (uint)(bVar1 != 0xff);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x68;
    } while (lVar9 < table->ColumnsCount);
    lVar8 = uVar6 + 1;
  }
  if (iVar4 < 2) {
    bVar11 = false;
  }
  else {
    bVar11 = (table->Flags & 0x4000000) == 0;
  }
  if (0 < iVar4 && !(bool)((bVar11 ^ 1U) & 1L << ((byte)iVar4 & 0x3f) == lVar8)) {
    iVar5 = 0;
    uVar6 = 0;
    do {
      uVar7 = 0xffffffff;
      if (0 < (long)table->ColumnsCount) {
        lVar8 = 0x56;
        uVar10 = 0;
        do {
          if ((uVar6 >> (uVar10 & 0x3f) & 1) == 0) {
            pIVar3 = (table->Columns).Data;
            cVar2 = *(char *)((long)&pIVar3->Flags + lVar8);
            if ((cVar2 != -1) && (((int)uVar7 == -1 || (cVar2 < pIVar3[(int)uVar7].SortOrder)))) {
              uVar7 = uVar10 & 0xffffffff;
            }
          }
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0x68;
        } while ((long)table->ColumnsCount != uVar10);
      }
      (table->Columns).Data[(int)uVar7].SortOrder = (ImGuiTableColumnIdx)iVar5;
      if (bVar11) {
        iVar4 = 1;
        if (0 < table->ColumnsCount) {
          lVar8 = 0x56;
          uVar10 = 0;
          do {
            if (uVar7 != uVar10) {
              *(undefined1 *)((long)&((table->Columns).Data)->Flags + lVar8) = 0xff;
            }
            uVar10 = uVar10 + 1;
            lVar8 = lVar8 + 0x68;
          } while ((long)uVar10 < (long)table->ColumnsCount);
        }
      }
      uVar6 = uVar6 | 1L << (uVar7 & 0x3f);
      iVar5 = iVar5 + 1;
    } while (!(bool)(iVar4 <= iVar5 | bVar11));
  }
  if (((iVar4 == 0) && (iVar4 = 0, (table->Flags & 0x8000000) == 0)) && (0 < table->ColumnsCount)) {
    lVar8 = 0;
    lVar9 = 0x66;
    iVar4 = 0;
    do {
      pIVar3 = (table->Columns).Data;
      bVar11 = true;
      if ((*(char *)((long)pIVar3 + lVar9 + -0xc) == '\x01') &&
         ((*(byte *)((long)pIVar3 + lVar9 + -0x65) & 2) == 0)) {
        *(undefined1 *)((long)pIVar3 + lVar9 + -0x10) = 0;
        *(byte *)((long)pIVar3 + lVar9 + -1) =
             *(byte *)((long)pIVar3 + lVar9 + -1) & 0xfc |
             *(byte *)((long)&pIVar3->Flags + lVar9) & 3;
        iVar4 = 1;
        bVar11 = false;
      }
      if (!bVar11) break;
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x68;
    } while (lVar8 < table->ColumnsCount);
  }
  table->SortSpecsCount = (ImGuiTableColumnIdx)iVar4;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}